

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O0

bool __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::remove_least_element_in_tree
          (binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,node *t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d,
          unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
          *r)

{
  binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  node *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool rvalue;
  node *child;
  node *next;
  node *in_stack_ffffffffffffffb8;
  node *local_30;
  node *pnVar1;
  node *local_10;
  
  pnVar1 = in_RSI->left;
  if (pnVar1 == *(node **)(in_RDI + 0x18)) {
    if (in_RSI->parent->left == in_RSI) {
      local_30 = in_RSI->right;
      in_RSI->parent->left = local_30;
    }
    else {
      local_30 = in_RSI->right;
      in_RSI->parent->right = local_30;
    }
    local_10 = in_RSI;
    if (in_RSI == *(node **)(in_RDI + 0x28)) {
      *(node **)(in_RDI + 0x28) = local_30;
    }
  }
  else {
    do {
      local_10 = pnVar1;
      pnVar1 = local_10->left;
    } while (pnVar1 != *(node **)(in_RDI + 0x18));
    local_30 = local_10->right;
    local_10->parent->left = local_30;
  }
  exchange<std::__cxx11::string>
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffb8);
  exchange<std::unique_ptr<dlib::logger::global_data::output_hook_container,std::default_delete<dlib::logger::global_data::output_hook_container>>>
            ((unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
              *)in_RDI,
             (unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
              *)in_stack_ffffffffffffffb8);
  local_30->parent = local_10->parent;
  if (local_10->color == '\x01') {
    fix_after_remove(in_RCX,pnVar1);
  }
  pnVar1 = *(node **)(in_RDI + 0x30);
  memory_manager_stateless_kernel_1<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node>
  ::deallocate((memory_manager_stateless_kernel_1<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node>
                *)in_RDI,in_stack_ffffffffffffffb8);
  return local_10 == pnVar1;
}

Assistant:

bool binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    remove_least_element_in_tree (
        node* t,
        domain& d,
        range& r
    ) 
    {

        node* next = t->left;
        node* child;  // the child node of the one we will slice out

        if (next == NIL)
        {
            // need to determine if t is a left or right child
            if (t->parent->left == t)
                child = t->parent->left = t->right;
            else
                child = t->parent->right = t->right;

            // update tree_root if necessary
            if (t == tree_root)
                tree_root = child;
        }
        else
        {
            // find the least node
            do 
            {
                t = next;
                next = next->left;
            } while (next != NIL);
            // t is a left child
            child = t->parent->left = t->right;

        }
        
        // swap the item from this node into d and r
        exchange(d,t->d);
        exchange(r,t->r);

        // plug hole left by removing this node
        child->parent = t->parent;

        // keep the red-black properties true
        if (t->color == black)
            fix_after_remove(child);

        bool rvalue = (t == current_element);
        // free the memory for this removed node
        pool.deallocate(t);        
        return rvalue;
    }